

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O3

void __thiscall cmCTestTestHandler::Initialize(cmCTestTestHandler *this)

{
  pointer pcVar1;
  pointer pcVar2;
  pointer piVar3;
  pointer pcVar4;
  pointer pcVar5;
  pointer this_00;
  pointer this_01;
  RegularExpression local_f0;
  
  cmCTestGenericHandler::Initialize(&this->super_cmCTestGenericHandler);
  (this->ElapsedTestingTime).__r = 0.0;
  pcVar1 = (this->TestResults).
           super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pcVar2 = (this->TestResults).
           super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_00 = pcVar1;
  if (pcVar2 != pcVar1) {
    do {
      cmCTestTestResult::~cmCTestTestResult(this_00);
      this_00 = this_00 + 1;
    } while (this_00 != pcVar2);
    (this->TestResults).
    super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
    ._M_impl.super__Vector_impl_data._M_finish = pcVar1;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(&this->CustomTestsIgnore,
                    (this->CustomTestsIgnore).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  (this->StartTest)._M_string_length = 0;
  *(this->StartTest)._M_dataplus._M_p = '\0';
  (this->EndTest)._M_string_length = 0;
  *(this->EndTest)._M_dataplus._M_p = '\0';
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(&this->CustomPreTest,
                    (this->CustomPreTest).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(&this->CustomPostTest,
                    (this->CustomPostTest).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  this->CustomMaximumPassedTestOutputSize = 0x400;
  this->CustomMaximumFailedTestOutputSize = 0x4b000;
  piVar3 = (this->TestsToRun).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->TestsToRun).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar3) {
    (this->TestsToRun).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
    ._M_finish = piVar3;
  }
  this->UseExcludeRegExpFirst = false;
  this->UseIncludeLabelRegExpFlag = false;
  this->UseExcludeLabelRegExpFlag = false;
  this->UseIncludeRegExpFlag = false;
  this->UseExcludeRegExpFlag = false;
  local_f0.regmatch.startp[0] = (char *)0x0;
  local_f0.regmatch.endp[0] = (char *)0x0;
  local_f0.regmatch.searchstring = (char *)0x0;
  local_f0.program = (char *)0x0;
  cmsys::RegularExpression::compile(&local_f0,"");
  cmsys::RegularExpression::operator=(&this->IncludeLabelRegularExpression,&local_f0);
  if (local_f0.program != (char *)0x0) {
    operator_delete__(local_f0.program);
  }
  local_f0.regmatch.startp[0] = (char *)0x0;
  local_f0.regmatch.endp[0] = (char *)0x0;
  local_f0.regmatch.searchstring = (char *)0x0;
  local_f0.program = (char *)0x0;
  cmsys::RegularExpression::compile(&local_f0,"");
  cmsys::RegularExpression::operator=(&this->ExcludeLabelRegularExpression,&local_f0);
  if (local_f0.program != (char *)0x0) {
    operator_delete__(local_f0.program);
  }
  (this->IncludeRegExp)._M_string_length = 0;
  *(this->IncludeRegExp)._M_dataplus._M_p = '\0';
  (this->ExcludeRegExp)._M_string_length = 0;
  *(this->ExcludeRegExp)._M_dataplus._M_p = '\0';
  (this->ExcludeFixtureRegExp)._M_string_length = 0;
  *(this->ExcludeFixtureRegExp)._M_dataplus._M_p = '\0';
  (this->ExcludeFixtureSetupRegExp)._M_string_length = 0;
  *(this->ExcludeFixtureSetupRegExp)._M_dataplus._M_p = '\0';
  (this->ExcludeFixtureCleanupRegExp)._M_string_length = 0;
  *(this->ExcludeFixtureCleanupRegExp)._M_dataplus._M_p = '\0';
  (this->TestsToRunString)._M_string_length = 0;
  *(this->TestsToRunString)._M_dataplus._M_p = '\0';
  this->UseUnion = false;
  pcVar4 = (this->TestList).
           super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pcVar5 = (this->TestList).
           super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_01 = pcVar4;
  if (pcVar5 != pcVar4) {
    do {
      cmCTestTestProperties::~cmCTestTestProperties(this_01);
      this_01 = this_01 + 1;
    } while (this_01 != pcVar5);
    (this->TestList).
    super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
    ._M_impl.super__Vector_impl_data._M_finish = pcVar4;
  }
  return;
}

Assistant:

void cmCTestTestHandler::Initialize()
{
  this->Superclass::Initialize();

  this->ElapsedTestingTime = cmDuration();

  this->TestResults.clear();

  this->CustomTestsIgnore.clear();
  this->StartTest.clear();
  this->EndTest.clear();

  this->CustomPreTest.clear();
  this->CustomPostTest.clear();
  this->CustomMaximumPassedTestOutputSize = 1 * 1024;
  this->CustomMaximumFailedTestOutputSize = 300 * 1024;

  this->TestsToRun.clear();

  this->UseIncludeLabelRegExpFlag = false;
  this->UseExcludeLabelRegExpFlag = false;
  this->UseIncludeRegExpFlag = false;
  this->UseExcludeRegExpFlag = false;
  this->UseExcludeRegExpFirst = false;
  this->IncludeLabelRegularExpression = "";
  this->ExcludeLabelRegularExpression = "";
  this->IncludeRegExp.clear();
  this->ExcludeRegExp.clear();
  this->ExcludeFixtureRegExp.clear();
  this->ExcludeFixtureSetupRegExp.clear();
  this->ExcludeFixtureCleanupRegExp.clear();

  TestsToRunString.clear();
  this->UseUnion = false;
  this->TestList.clear();
}